

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferAtomicFunctions.cpp
# Opt level: O1

IterateResult __thiscall
glcts::TextureBufferAtomicFunctions::iterate(TextureBufferAtomicFunctions *this)

{
  ostringstream *this_00;
  GLuint GVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  long lVar5;
  char *description;
  qpTestResult testResult;
  TestContext *this_01;
  long lVar6;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar4;
  
  initTest(this);
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar4 + 0x1680))(this->m_po_id);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Error setting active program object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferAtomicFunctions.cpp"
                  ,0xb5);
  (**(code **)(lVar4 + 0x80))(0,this->m_tbo_tex_id,0,0,0,0x88ba,0x8236);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Error binding texture object to image unit 0!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferAtomicFunctions.cpp"
                  ,0xb8);
  (**(code **)(lVar4 + 0x528))(1,1,1);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Error running compute shader!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferAtomicFunctions.cpp"
                  ,0xbb);
  (**(code **)(lVar4 + 0xdb8))(0x200);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Error setting memory barrier!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferAtomicFunctions.cpp"
                  ,0xbe);
  lVar5 = (**(code **)(lVar4 + 0xd00))
                    ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0,
                     (ulong)this->m_n_texels_in_texture_buffer << 2,1);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Error mapping buffer object\'s data store to client address space!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferAtomicFunctions.cpp"
                  ,0xc3);
  GVar1 = this->m_n_texels_in_texture_buffer;
  if (GVar1 != 0) {
    lVar6 = 0;
    do {
      if (*(uint *)(lVar5 + lVar6 * 4) != (GVar1 - 1) * GVar1 >> 1) {
        local_1b0._0_8_ =
             ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        this_00 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"Result is different than expected at index: ",0x2c);
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"Expected value: ",0x10);
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"Result   value: ",0x10);
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_138);
        (**(code **)(lVar4 + 0x1670))((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER);
        this_01 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
        description = "Fail";
        testResult = QP_TEST_RESULT_FAIL;
        goto LAB_00d66799;
      }
      lVar6 = lVar6 + 1;
    } while (GVar1 != (GLuint)lVar6);
  }
  (**(code **)(lVar4 + 0x1670))((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER);
  this_01 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
  description = "Pass";
  testResult = QP_TEST_RESULT_PASS;
LAB_00d66799:
  tcu::TestContext::setTestResult(this_01,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult TextureBufferAtomicFunctions::iterate(void)
{
	/* Initialize */
	initTest();

	/* Get Gl entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	bool test_result = true;

	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting active program object!");

	gl.bindImageTexture(0, m_tbo_tex_id, 0, GL_FALSE, 0, GL_READ_WRITE, GL_R32UI);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object to image unit 0!");

	gl.dispatchCompute(1, 1, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error running compute shader!");

	gl.memoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting memory barrier!");

	/* Get result data */
	glw::GLuint* result = (glw::GLuint*)gl.mapBufferRange(
		m_glExtTokens.TEXTURE_BUFFER, 0, m_n_texels_in_texture_buffer * sizeof(glw::GLuint), GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error mapping buffer object's data store to client address space!");

	glw::GLuint expected_value = (m_n_texels_in_texture_buffer * (m_n_texels_in_texture_buffer - 1)) / 2;

	for (glw::GLuint i = 0; i < m_n_texels_in_texture_buffer; ++i)
	{
		/* Log error if expected data and result data are not equal */
		if (result[i] != expected_value)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Result is different than expected at index: " << i << "\n"
							   << "Expected value: " << expected_value << "\n"
							   << "Result   value: " << result[i] << "\n"
							   << tcu::TestLog::EndMessage;

			test_result = false;
			break;
		}
	}

	gl.unmapBuffer(m_glExtTokens.TEXTURE_BUFFER);

	if (test_result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}